

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.cc
# Opt level: O1

void __thiscall mp::BinaryFormatter::nput(BinaryFormatter *this,File *nm,double r)

{
  long lVar1;
  
  if ((r <= 2147483647.0) && (-2147483648.0 <= r)) {
    lVar1 = (long)r;
    if (((double)lVar1 == r) && (!NAN((double)lVar1) && !NAN(r))) {
      if ((short)lVar1 == lVar1) {
        apr(this,nm,"s%h",(ulong)(uint)(int)(short)lVar1);
        return;
      }
      apr(this,nm,"l%l");
      return;
    }
  }
  apr(this,nm,"n%g");
  return;
}

Assistant:

void BinaryFormatter::nput(File& nm, double r)
{
  double x;
  long L;
  short sh;

  if ((x = r) <= 2147483647.
      && x >= -2147483648.
      && (L = (long)x, (double)x == L)) {
    sh = (short)L;
    if (sh == L)
      apr(nm, "s%h", sh);
    else
      apr(nm, "l%l", L);
  }
  else
    apr(nm, "n%g", x);
}